

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::variable_storage_is_aliased(Compiler *this,SPIRVariable *v)

{
  bool bVar1;
  SPIRType *pSVar2;
  mapped_type *pmVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Bitset local_70;
  
  pSVar2 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      *(uint *)&(v->super_IVariant).field_0xc);
  if (v->storage == StorageBuffer) {
    bVar6 = pSVar2->basetype == Image;
    bVar7 = pSVar2->basetype == AtomicCounter;
    bVar8 = pSVar2->storage == PhysicalStorageBuffer;
  }
  else {
    pmVar3 = ::std::__detail::
             _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->ir).meta,&(pSVar2->super_IVariant).self);
    bVar6 = pSVar2->basetype == Image;
    bVar7 = pSVar2->basetype == AtomicCounter;
    bVar8 = pSVar2->storage == PhysicalStorageBuffer;
    if (((pmVar3->decoration).decoration_flags.lower & 8) == 0) {
      bVar5 = ParsedIR::has_decoration(&this->ir,(ID)(v->super_IVariant).self.id,DecorationRestrict)
      ;
      bVar1 = false;
      goto LAB_007a52cb;
    }
  }
  ParsedIR::get_buffer_block_flags(&local_70,&this->ir,v);
  bVar5 = (bool)((byte)((uint)local_70.lower >> 0x13) & 1);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70.higher._M_h);
  bVar1 = true;
LAB_007a52cb:
  bVar4 = (bool)(bVar5 ^ 1);
  bVar7 = (bool)(bVar8 | bVar7);
  if (bVar6) {
    bVar7 = bVar4;
  }
  if (bVar5 != false) {
    bVar7 = bVar4;
  }
  if (bVar1) {
    bVar7 = bVar4;
  }
  return bVar7;
}

Assistant:

bool Compiler::variable_storage_is_aliased(const SPIRVariable &v)
{
	auto &type = get<SPIRType>(v.basetype);
	bool ssbo = v.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool image = type.basetype == SPIRType::Image;
	bool counter = type.basetype == SPIRType::AtomicCounter;
	bool buffer_reference = type.storage == StorageClassPhysicalStorageBufferEXT;

	bool is_restrict;
	if (ssbo)
		is_restrict = ir.get_buffer_block_flags(v).get(DecorationRestrict);
	else
		is_restrict = has_decoration(v.self, DecorationRestrict);

	return !is_restrict && (ssbo || image || counter || buffer_reference);
}